

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptron.hpp
# Opt level: O0

void __thiscall Preceptron_SIGMOID::Backward(Preceptron_SIGMOID *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  size_type sVar4;
  reference pvVar5;
  double extraout_XMM0_Qa;
  double dVar6;
  undefined1 auVar7 [16];
  int local_34;
  double dStack_30;
  int i_1;
  double average_bias_error;
  double internal_weight_error;
  double derivation;
  int i;
  Preceptron_SIGMOID *this_local;
  
  derivation._4_4_ = 0;
  while( true ) {
    sVar4 = std::vector<double,_std::allocator<double>_>::size(&(this->super_Preceptron).weight);
    if (sVar4 <= (ulong)(long)derivation._4_4_) break;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(this->super_Preceptron).input,(long)derivation._4_4_);
    (*(this->super_Preceptron)._vptr_Preceptron[2])(*pvVar5);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(this->super_Preceptron).input,(long)derivation._4_4_);
    dVar6 = *pvVar5 * extraout_XMM0_Qa * (this->super_Preceptron).error;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(this->super_Preceptron).weight,(long)derivation._4_4_);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(this->super_Preceptron).delta_weight,(long)derivation._4_4_);
    *pvVar5 = dVar1 * dVar6;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(this->super_Preceptron).delta_weight,(long)derivation._4_4_);
    dVar1 = *pvVar5;
    dVar2 = (this->super_Preceptron).motivation;
    dVar3 = (this->super_Preceptron).learning_step;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(this->super_Preceptron).weight,(long)derivation._4_4_);
    *pvVar5 = dVar1 * dVar2 + dVar3 * dVar6 + *pvVar5;
    dVar1 = (this->super_Preceptron).error;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(this->super_Preceptron).delta_bias,(long)derivation._4_4_);
    *pvVar5 = extraout_XMM0_Qa * dVar1;
    derivation._4_4_ = derivation._4_4_ + 1;
  }
  if (((this->super_Preceptron).useBias & 1U) != 0) {
    dStack_30 = 0.0;
    local_34 = 0;
    while( true ) {
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        (&(this->super_Preceptron).delta_bias);
      if (sVar4 <= (ulong)(long)local_34) break;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->super_Preceptron).delta_bias,(long)local_34);
      dStack_30 = *pvVar5 + dStack_30;
      local_34 = local_34 + 1;
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size(&(this->super_Preceptron).delta_bias)
    ;
    auVar7._8_4_ = (int)(sVar4 >> 0x20);
    auVar7._0_8_ = sVar4;
    auVar7._12_4_ = 0x45300000;
    (this->super_Preceptron).bias =
         (this->super_Preceptron).learning_step *
         (dStack_30 /
         ((auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0))) +
         (this->super_Preceptron).bias;
  }
  return;
}

Assistant:

void Backward() {
		for (int i = 0; i < weight.size(); i++) {
			double derivation = Derivation(input[i]);
			double internal_weight_error = input[i] * derivation * error;
			delta_weight[i] = weight[i] * internal_weight_error;
			weight[i] += delta_weight[i] * motivation + learning_step * internal_weight_error;
			delta_bias[i] = derivation * error;
		}
		if (useBias) {
			double average_bias_error = 0.0;
			for (int i = 0; i < delta_bias.size(); i++) {
				average_bias_error += delta_bias[i];
			}average_bias_error /= delta_bias.size();
			bias += learning_step * average_bias_error;
		}
	}